

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::consumeNamesTable
          (ZoneStringsLoader *this,char *key,ResourceValue *value,UBool noFallback,
          UErrorCode *status)

{
  UHashtable *pUVar1;
  UBool UVar2;
  char *value_00;
  size_t sVar3;
  char16_t *key_00;
  void *pvVar4;
  UnicodeString mzID;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  value_00 = (char *)uhash_get_63(this->keyToLoader,key);
  if ((long *)value_00 == (long *)0x0) {
    UVar2 = isMetaZone(this,key);
    if (UVar2 == '\0') {
      tzIDFromKey(&local_70,this,key);
      pUVar1 = this->tzn->fTZNamesMap;
      key_00 = UnicodeString::getTerminatedBuffer(&local_70);
      pvVar4 = uhash_get_63(pUVar1,key_00);
    }
    else {
      sVar3 = strlen(key);
      UnicodeString::UnicodeString(&local_70,key + 5,(int)sVar3 + -5,kInvariant);
      pUVar1 = this->tzn->fMZNamesMap;
      key_00 = UnicodeString::getTerminatedBuffer(&local_70);
      pvVar4 = uhash_get_63(pUVar1,key_00);
    }
    if (pvVar4 == (void *)0x0) {
      value_00 = (char *)UMemory::operator_new((UMemory *)0x40,(size_t)key_00);
      if ((long *)value_00 == (long *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        UnicodeString::~UnicodeString(&local_70);
        return;
      }
      *(undefined ***)value_00 = &PTR__ZNamesLoader_003d2f10;
      *(long *)((long)value_00 + 8) = 0;
      *(long *)((long)value_00 + 0x10) = 0;
      *(long *)((long)value_00 + 0x18) = 0;
      *(long *)((long)value_00 + 0x20) = 0;
      *(long *)((long)value_00 + 0x28) = 0;
      *(long *)((long)value_00 + 0x30) = 0;
      *(long *)((long)value_00 + 0x38) = 0;
    }
    else {
      value_00 = "<dummy>";
    }
    UnicodeString::~UnicodeString(&local_70);
    pvVar4 = createKey(this,key,status);
    if (U_ZERO_ERROR < *status) {
      if (value_00 == "<dummy>") {
        return;
      }
      (**(code **)(*(long *)value_00 + 8))(value_00);
      return;
    }
    uhash_put_63(this->keyToLoader,pvVar4,value_00,status);
    if (U_ZERO_ERROR < *status) {
      return;
    }
  }
  if (value_00 != "<dummy>") {
    (**(code **)(*(long *)value_00 + 0x18))(value_00,key,value,(int)noFallback,status);
  }
  return;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }